

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_result_modifier.cpp
# Opt level: O2

unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true> __thiscall
duckdb::DistinctModifier::Deserialize(DistinctModifier *this,Deserializer *deserializer)

{
  pointer pDVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>_> local_18
  ;
  
  local_18._M_t.
  super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
  .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl =
       (tuple<duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>)
       operator_new(0x28);
  *(undefined1 *)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
          .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl + 8) = 3;
  *(undefined ***)
   local_18._M_t.
   super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
   .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl =
       &PTR__DistinctModifier_0278a798;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
          .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl + 0x20) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
          .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl + 0x10) =
       (_func_int *)0x0;
  *(_func_int **)
   ((long)local_18._M_t.
          super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
          .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl + 0x18) =
       (_func_int *)0x0;
  pDVar1 = unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
           ::operator->((unique_ptr<duckdb::DistinctModifier,_std::default_delete<duckdb::DistinctModifier>,_true>
                         *)&local_18);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (deserializer,200,"distinct_on_targets",&pDVar1->distinct_on_targets);
  (this->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)
       local_18._M_t.
       super__Tuple_impl<0UL,_duckdb::DistinctModifier_*,_std::default_delete<duckdb::DistinctModifier>_>
       .super__Head_base<0UL,_duckdb::DistinctModifier_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)
         (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>_>)this;
}

Assistant:

unique_ptr<ResultModifier> DistinctModifier::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DistinctModifier>(new DistinctModifier());
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(200, "distinct_on_targets", result->distinct_on_targets);
	return std::move(result);
}